

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfuda_cache.hpp
# Opt level: O1

void __thiscall
cappuccino::
lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::lfuda_cache(lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
              *this,size_t capacity,milliseconds dynamic_age_tick,float dynamic_age_ratio,
             float max_load_factor)

{
  _Rb_tree_header *p_Var1;
  __hashtable *__this;
  double dVar2;
  undefined1 auVar3 [16];
  allocator_type local_25;
  float local_24;
  
  auVar3 = ZEXT416(0);
  *(undefined1 (*) [16])&(this->m_lock).m_lock.super___mutex_base._M_mutex.__data.__list.__next =
       auVar3;
  *(undefined1 (*) [16])((long)&(this->m_lock).m_lock.super___mutex_base._M_mutex + 0x10) = auVar3;
  *(undefined1 (*) [16])&(this->m_lock).m_lock.super___mutex_base._M_mutex = auVar3;
  (this->m_dynamic_age_tick).__r = dynamic_age_tick.__r;
  this->m_dynamic_age_ratio = dynamic_age_ratio;
  (this->m_keyed_elements)._M_h._M_buckets = &(this->m_keyed_elements)._M_h._M_single_bucket;
  (this->m_keyed_elements)._M_h._M_bucket_count = 1;
  (this->m_keyed_elements)._M_h._M_before_begin = (__node_base)auVar3._0_8_;
  (this->m_keyed_elements)._M_h._M_element_count = auVar3._8_8_;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->m_keyed_elements)._M_h._M_rehash_policy._M_next_resize = auVar3;
  p_Var1 = &(this->m_lfu_list)._M_t._M_impl.super__Rb_tree_header;
  (this->m_lfu_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_lfu_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_lfu_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_lfu_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_lfu_list)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_24 = max_load_factor;
  std::__cxx11::
  list<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::list(&this->m_dynamic_age_list,capacity,&local_25);
  (this->m_open_list_end)._M_node =
       (this->m_dynamic_age_list).
       super__List_base<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_max_load_factor = local_24;
  auVar3._8_4_ = (int)(capacity >> 0x20);
  auVar3._0_8_ = capacity;
  auVar3._12_4_ = 0x45300000;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_next_resize = 0;
  dVar2 = ceil(((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)capacity) - 4503599627370496.0)) / (double)local_24
              );
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->m_keyed_elements)._M_h,
           (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2);
  return;
}

Assistant:

explicit lfuda_cache(
        size_t                    capacity,
        std::chrono::milliseconds dynamic_age_tick  = std::chrono::minutes{1},
        float                     dynamic_age_ratio = 0.5f,
        float                     max_load_factor   = 1.0f)
        : m_dynamic_age_tick(dynamic_age_tick),
          m_dynamic_age_ratio(dynamic_age_ratio),
          m_dynamic_age_list(capacity)
    {
        m_open_list_end = m_dynamic_age_list.begin();

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }